

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void P_SpawnBlood(DVector3 *pos1,DAngle *dir,int damage,AActor *originator)

{
  int iVar1;
  uint uVar2;
  uint32 uVar3;
  DWORD DVar4;
  AActor *pAVar5;
  bool bVar6;
  TAngle<double> local_90;
  int local_84;
  PClassActor *pPStack_80;
  int checked_advance;
  PClassActor *cls;
  int advance;
  FState *state;
  TFlags<ActorFlag4,_unsigned_int> local_60;
  int local_5c;
  undefined1 local_58 [4];
  int bloodtype;
  DVector3 pos;
  PClassActor *bloodcls;
  AActor *pAStack_30;
  PalEntry bloodcolor;
  AActor *th;
  AActor *originator_local;
  int damage_local;
  DAngle *dir_local;
  DVector3 *pos1_local;
  
  bloodcls._4_4_ =
       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
       AActor::GetBloodColor(originator);
  pos.Z = (double)AActor::GetBloodType(originator,0);
  TVector3<double>::TVector3((TVector3<double> *)local_58,pos1);
  iVar1 = FRandom::Random2(&pr_spawnblood);
  pos.Y = (double)iVar1 / 64.0 + pos.Y;
  local_5c = FIntCVar::operator_cast_to_int(&cl_bloodtype);
  bVar6 = false;
  if (pos.Z != 0.0) {
    pAVar5 = GetDefaultByType((PClass *)pos.Z);
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_60,
               (int)pAVar5 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_60);
    bVar6 = uVar2 == 0;
  }
  if (bVar6) {
    local_5c = 0;
  }
  if (pos.Z == 0.0) goto LAB_0069da5b;
  pAStack_30 = Spawn((PClassActor *)pos.Z,(DVector3 *)local_58,NO_REPLACE);
  (pAStack_30->Vel).Z = 2.0;
  TAngle<double>::operator=(&(pAStack_30->Angles).Yaw,dir);
  TFlags<ActorFlag5,_unsigned_int>::operator&
            ((TFlags<ActorFlag5,_unsigned_int> *)((long)&state + 4),
             (int)pAStack_30 +
             (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|MF5_NODROPOFF));
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&state + 4));
  if (uVar2 != 0) {
    TObjPtr<AActor>::operator=(&pAStack_30->target,originator);
  }
  if ((gameinfo.gametype & GAME_DoomChex) != GAME_Any) {
    uVar2 = FRandom::operator()(&pr_spawnblood);
    pAStack_30->tics = pAStack_30->tics - (uVar2 & 3);
    if (pAStack_30->tics < 1) {
      pAStack_30->tics = 1;
    }
  }
  uVar3 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((long)&bloodcls + 4));
  bVar6 = false;
  if (uVar3 != 0) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              ((TFlags<ActorFlag2,_unsigned_int> *)&state,
               (int)pAStack_30 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&state);
    bVar6 = uVar2 == 0;
  }
  if (bVar6) {
    DVar4 = TRANSLATION('\b',bloodcls._4_4_ >> 0x18);
    pAStack_30->Translation = DVar4;
  }
  pAVar5 = pAStack_30;
  if ((gameinfo.gametype & GAME_DoomStrifeChex) != GAME_Any) {
    originator_local._4_4_ = damage;
    if (gameinfo.gametype == GAME_Strife) {
      if (damage < 0xe) {
        originator_local._4_4_ = damage + 2;
      }
      else {
        FName::FName((FName *)((long)&cls + 4),NAME_Spray);
        _advance = AActor::FindState(pAVar5,(FName *)((long)&cls + 4));
        if (_advance != (FState *)0x0) {
          AActor::SetState(pAStack_30,_advance,false);
          goto LAB_0069da3e;
        }
      }
    }
    cls._0_4_ = 0;
    if ((originator_local._4_4_ < 0xd) && (8 < originator_local._4_4_)) {
      cls._0_4_ = 1;
    }
    else if (originator_local._4_4_ < 9) {
      cls._0_4_ = 2;
    }
    for (pPStack_80 = AActor::GetClass(pAStack_30);
        pPStack_80 != (PClassActor *)AActor::RegistrationInfo.MyClass;
        pPStack_80 = (PClassActor *)(pPStack_80->super_PClass).ParentClass) {
      local_84 = (int)cls;
      bVar6 = PClassActor::OwnsState(pPStack_80,pAStack_30->SpawnState);
      if (bVar6) {
        for (; 0 < local_84; local_84 = local_84 + -1) {
          bVar6 = PClassActor::OwnsState(pPStack_80,pAStack_30->SpawnState + local_84);
          if (bVar6) {
            AActor::SetState(pAStack_30,pAStack_30->SpawnState + local_84,false);
            goto LAB_0069da3e;
          }
        }
      }
    }
  }
LAB_0069da3e:
  if (1 < local_5c) {
    TFlags<ActorRenderFlag,_unsigned_int>::operator|=(&pAStack_30->renderflags,RF_INVISIBLE);
  }
LAB_0069da5b:
  if (0 < local_5c) {
    TAngle<double>::TAngle(&local_90,dir);
    uVar3 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((long)&bloodcls + 4));
    P_DrawSplash2(0x28,(DVector3 *)local_58,&local_90,2,uVar3);
  }
  return;
}

Assistant:

void P_SpawnBlood (const DVector3 &pos1, DAngle dir, int damage, AActor *originator)
{
	AActor *th;
	PalEntry bloodcolor = originator->GetBloodColor();
	PClassActor *bloodcls = originator->GetBloodType();
	DVector3 pos = pos1;
	pos.Z += pr_spawnblood.Random2() / 64.;

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	if (bloodcls != NULL)
	{
		th = Spawn(bloodcls, pos, NO_REPLACE); // GetBloodType already performed the replacement
		th->Vel.Z = 2;
		th->Angles.Yaw = dir;
		// [NG] Applying PUFFGETSOWNER to the blood will make it target the owner
		if (th->flags5 & MF5_PUFFGETSOWNER) th->target = originator;
		if (gameinfo.gametype & GAME_DoomChex)
		{
			th->tics -= pr_spawnblood() & 3;

			if (th->tics < 1)
				th->tics = 1;
		}
		// colorize the blood
		if (bloodcolor != 0 && !(th->flags2 & MF2_DONTTRANSLATE))
		{
			th->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}
		
		// Moved out of the blood actor so that replacing blood is easier
		if (gameinfo.gametype & GAME_DoomStrifeChex)
		{
			if (gameinfo.gametype == GAME_Strife)
			{
				if (damage > 13)
				{
					FState *state = th->FindState(NAME_Spray);
					if (state != NULL)
					{
						th->SetState (state);
						goto statedone;
					}
				}
				else damage += 2;
			}
			int advance = 0;
			if (damage <= 12 && damage >= 9)
			{
				advance = 1;
			}
			else if (damage < 9)
			{
				advance = 2;
			}

			PClassActor *cls = th->GetClass();

			while (cls != RUNTIME_CLASS(AActor))
			{
				int checked_advance = advance;
				if (cls->OwnsState(th->SpawnState))
				{
					for (; checked_advance > 0; --checked_advance)
					{
						// [RH] Do not set to a state we do not own.
						if (cls->OwnsState(th->SpawnState + checked_advance))
						{
							th->SetState(th->SpawnState + checked_advance);
							goto statedone;
						}
					}
				}
				// We can safely assume the ParentClass is of type PClassActor
				// since we stop when we see the Actor base class.
				cls = static_cast<PClassActor *>(cls->ParentClass);
			}
		}

	statedone:
		if (!(bloodtype <= 1)) th->renderflags |= RF_INVISIBLE;
	}

	if (bloodtype >= 1)
		P_DrawSplash2 (40, pos, dir, 2, bloodcolor);
}